

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

Table * luaH_new(lua_State *L,int narray,int nhash)

{
  global_State *pgVar1;
  GCObject *t;
  
  t = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x40);
  pgVar1 = L->l_G;
  (t->gch).next = pgVar1->rootgc;
  pgVar1->rootgc = t;
  (t->gch).marked = pgVar1->currentwhite & 3;
  (t->gch).tt = '\x05';
  (t->h).metatable = (Table *)0x0;
  (t->h).array = (TValue *)0x0;
  *(lu_byte *)((long)t + 10) = 0xff;
  *(lu_byte *)((long)t + 0xb) = '\0';
  (t->h).sizearray = 0;
  (t->h).node = &dummynode_;
  setarrayvector(L,&t->h,narray);
  setnodevector(L,&t->h,nhash);
  return (Table *)t;
}

Assistant:

static Table*luaH_new(lua_State*L,int narray,int nhash){
Table*t=luaM_new(L,Table);
luaC_link(L,obj2gco(t),5);
t->metatable=NULL;
t->flags=cast_byte(~0);
t->array=NULL;
t->sizearray=0;
t->lsizenode=0;
t->node=cast(Node*,(&dummynode_));
setarrayvector(L,t,narray);
setnodevector(L,t,nhash);
return t;
}